

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O2

Node * __thiscall
mapbox::detail::Earcut<long>::
ObjectPool<mapbox::detail::Earcut<long>::Node,std::allocator<mapbox::detail::Earcut<long>::Node>>::
construct<long,double,double>
          (ObjectPool<mapbox::detail::Earcut<long>::Node,std::allocator<mapbox::detail::Earcut<long>::Node>>
           *this,long *args,double *args_1,double *args_2)

{
  undefined8 *puVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  Node *pNVar5;
  long lVar6;
  ulong uVar7;
  
  uVar7 = *(ulong *)(this + 8);
  if (*(ulong *)(this + 0x10) <= uVar7) {
    uVar7 = 0;
    pNVar5 = __gnu_cxx::new_allocator<mapbox::detail::Earcut<long>::Node>::allocate
                       ((new_allocator<mapbox::detail::Earcut<long>::Node> *)(this + 0x30),
                        *(ulong *)(this + 0x10),(void *)0x0);
    *(Node **)this = pNVar5;
    std::
    vector<mapbox::detail::Earcut<long>::Node*,std::allocator<mapbox::detail::Earcut<long>::Node*>>
    ::emplace_back<mapbox::detail::Earcut<long>::Node*&>
              ((vector<mapbox::detail::Earcut<long>::Node*,std::allocator<mapbox::detail::Earcut<long>::Node*>>
                *)(this + 0x18),(Node **)this);
  }
  lVar4 = *(long *)this;
  *(ulong *)(this + 8) = uVar7 + 1;
  lVar6 = uVar7 * 0x48;
  dVar2 = *args_1;
  dVar3 = *args_2;
  *(long *)(lVar4 + lVar6) = *args;
  *(double *)(lVar4 + 8 + lVar6) = dVar2;
  *(double *)(lVar4 + 0x10 + lVar6) = dVar3;
  *(undefined4 *)(lVar4 + 0x28 + lVar6) = 0;
  puVar1 = (undefined8 *)(lVar4 + 0x18 + lVar6);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1 = (undefined8 *)(lVar4 + 0x30 + lVar6);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined1 *)(lVar4 + 0x40 + lVar6) = 0;
  return (Node *)(lVar4 + lVar6);
}

Assistant:

T* construct(Args&&... args) {
            if (currentIndex >= blockSize) {
                currentBlock = alloc.allocate(blockSize);
                allocations.emplace_back(currentBlock);
                currentIndex = 0;
            }
            T* object = &currentBlock[currentIndex++];
            alloc.construct(object, std::forward<Args>(args)...);
            return object;
        }